

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O1

int __thiscall MeCab::ContextID::rid(ContextID *this,char *r)

{
  const_iterator cVar1;
  ostream *poVar2;
  size_t sVar3;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,r,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->right_)._M_t,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar1._M_node == &(this->right_)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"it != right_.end()",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"cannot find RIGHT-ID  for ",0x1a);
    if (r == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,r,sVar3);
    }
    die::~die((die *)&local_38);
  }
  return cVar1._M_node[2]._M_color;
}

Assistant:

int ContextID::rid(const char *r) const {
  std::map<std::string, int>::const_iterator it = right_.find(r);
  CHECK_DIE(it != right_.end())
      << "cannot find RIGHT-ID  for " << r;
  return it->second;
}